

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaB_next(lua_State *L)

{
  TValue *key;
  double dVar1;
  StkId pTVar2;
  StkId pTVar3;
  GCObject *t;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int *piVar9;
  Node *pNVar10;
  ulong uVar11;
  Value *pVVar12;
  StkId pTVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  StkId pTVar18;
  int iVar20;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  luaL_checktype(L,1,5);
  auVar6 = _DAT_00115030;
  auVar5 = _DAT_00115020;
  auVar4 = _DAT_00115010;
  pTVar2 = L->top;
  pTVar3 = L->base;
  pTVar18 = pTVar3 + 2;
  if (pTVar2 < pTVar18) {
    pTVar13 = pTVar2 + 1;
    if (pTVar2 + 1 < pTVar3 + 2) {
      pTVar13 = pTVar3 + 2;
    }
    uVar11 = (long)&pTVar13->value + ~(ulong)pTVar2;
    auVar22._8_4_ = (int)uVar11;
    auVar22._0_8_ = uVar11;
    auVar22._12_4_ = (int)(uVar11 >> 0x20);
    auVar19._0_8_ = uVar11 >> 4;
    auVar19._8_8_ = auVar22._8_8_ >> 4;
    piVar9 = &pTVar2[3].tt;
    uVar14 = 0;
    auVar19 = auVar19 ^ _DAT_00115030;
    do {
      auVar21._8_4_ = (int)uVar14;
      auVar21._0_8_ = uVar14;
      auVar21._12_4_ = (int)(uVar14 >> 0x20);
      auVar22 = (auVar21 | auVar5) ^ auVar6;
      iVar20 = auVar19._4_4_;
      if ((bool)(~(auVar22._4_4_ == iVar20 && auVar19._0_4_ < auVar22._0_4_ ||
                  iVar20 < auVar22._4_4_) & 1)) {
        piVar9[-0xc] = 0;
      }
      if ((auVar22._12_4_ != auVar19._12_4_ || auVar22._8_4_ <= auVar19._8_4_) &&
          auVar22._12_4_ <= auVar19._12_4_) {
        piVar9[-8] = 0;
      }
      auVar22 = (auVar21 | auVar4) ^ auVar6;
      iVar7 = auVar22._4_4_;
      if (iVar7 <= iVar20 && (iVar7 != iVar20 || auVar22._0_4_ <= auVar19._0_4_)) {
        piVar9[-4] = 0;
        *piVar9 = 0;
      }
      uVar14 = uVar14 + 4;
      piVar9 = piVar9 + 0x10;
    } while (((uVar11 >> 4) + 4 & 0xfffffffffffffffc) != uVar14);
  }
  L->top = pTVar18;
  t = (pTVar3->value).gc;
  key = pTVar3 + 1;
  iVar20 = pTVar3[1].tt;
  if (iVar20 == 3) {
    dVar1 = (key->value).n;
    iVar7 = (int)dVar1;
    if ((((iVar7 < 1) || (dVar1 != (double)(int)dVar1)) || (NAN(dVar1) || NAN((double)(int)dVar1)))
       || (iVar8 = (t->h).sizearray, iVar8 < iVar7)) goto LAB_00109861;
    iVar7 = iVar7 + -1;
  }
  else if (iVar20 == 0) {
    iVar8 = (t->h).sizearray;
    iVar7 = -1;
  }
  else {
LAB_00109861:
    pNVar10 = mainposition(&t->h,key);
    while( true ) {
      iVar7 = luaO_rawequalObj(&(pNVar10->i_key).tvk,key);
      if ((iVar7 != 0) ||
         (((3 < iVar20 && ((pNVar10->i_key).nk.tt == 0xb)) &&
          ((pNVar10->i_key).nk.value.gc == (key->value).gc)))) break;
      pNVar10 = (pNVar10->i_key).nk.next;
      if (pNVar10 == (Node *)0x0) {
        luaG_runerror(L,"invalid key to \'next\'");
      }
    }
    iVar8 = (t->h).sizearray;
    iVar7 = (int)((ulong)((long)pNVar10 - (long)(t->h).node) >> 3) * -0x33333333 + iVar8;
  }
  lVar15 = (long)iVar7 + 1;
  iVar20 = iVar8;
  if (iVar8 < lVar15) {
    iVar20 = (int)lVar15;
  }
  lVar16 = (long)iVar7 << 4;
  do {
    lVar17 = lVar16;
    if (iVar8 <= lVar15) {
      if ((int)(1L << ((t->h).lsizenode & 0x3f)) <= iVar20 - iVar8) goto LAB_00109977;
      pNVar10 = (t->h).node;
      lVar16 = (long)((int)lVar15 - iVar8);
      lVar15 = lVar16 * 0x28;
      goto LAB_00109964;
    }
    lVar15 = lVar15 + 1;
    lVar16 = lVar17 + 0x10;
  } while (*(int *)((long)&(t->h).array[1].tt + lVar17) == 0);
  pTVar3[1].value.n = (double)(int)lVar15;
  pTVar3[1].tt = 3;
  pVVar12 = (Value *)((long)&(t->h).array[1].value + lVar17);
LAB_00109999:
  pTVar3[2].value = *pVVar12;
  pTVar3[2].tt = pVVar12[1].b;
  pTVar18 = L->top + 1;
  iVar20 = 2;
LAB_001099b4:
  L->top = pTVar18;
  return iVar20;
  while( true ) {
    lVar16 = lVar16 + 1;
    lVar15 = lVar15 + 0x28;
    if ((0x100000000 << ((t->h).lsizenode & 0x3f)) >> 0x20 <= lVar16) break;
LAB_00109964:
    if (*(int *)((long)&(pNVar10->i_val).tt + lVar15) != 0) {
      pTVar3[1].value = *(Value *)((long)&pNVar10->i_key + lVar15);
      pTVar3[1].tt = *(int *)((long)&pNVar10->i_key + lVar15 + 8);
      pVVar12 = (Value *)((long)&(((t->h).node)->i_val).value + lVar15);
      goto LAB_00109999;
    }
  }
LAB_00109977:
  pTVar3[1].tt = 0;
  iVar20 = 1;
  goto LAB_001099b4;
}

Assistant:

static int luaB_next(lua_State*L){
luaL_checktype(L,1,5);
lua_settop(L,2);
if(lua_next(L,1))
return 2;
else{
lua_pushnil(L);
return 1;
}
}